

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerVk::BindResource
          (ShaderVariableManagerVk *this,Uint32 ResIndex,BindResourceInfo *BindInfo)

{
  undefined1 local_60 [8];
  BindResourceHelper BindHelper;
  BindResourceInfo *BindInfo_local;
  Uint32 ResIndex_local;
  ShaderVariableManagerVk *this_local;
  
  BindHelper.m_DstRes = (Resource *)BindInfo;
  anon_unknown_77::BindResourceHelper::BindResourceHelper
            ((BindResourceHelper *)local_60,
             (this->
             super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
             ).m_pSignature,
             (this->
             super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
             ).m_ResourceCache,ResIndex,BindInfo->ArrayIndex);
  anon_unknown_77::BindResourceHelper::operator()
            ((BindResourceHelper *)local_60,(BindResourceInfo *)BindHelper.m_DstRes);
  return;
}

Assistant:

void ShaderVariableManagerVk::BindResource(Uint32 ResIndex, const BindResourceInfo& BindInfo)
{
    BindResourceHelper BindHelper{
        *m_pSignature,
        m_ResourceCache,
        ResIndex,
        BindInfo.ArrayIndex};

    BindHelper(BindInfo);
}